

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_CPS(DisasContext_conflict1 *s,arg_CPS *a)

{
  int iVar1;
  uint local_28;
  uint local_24;
  uint32_t val;
  uint32_t mask;
  arg_CPS *a_local;
  DisasContext_conflict1 *s_local;
  
  iVar1 = arm_dc_feature(s,3);
  if ((iVar1 == 0) || (iVar1 = arm_dc_feature(s,9), iVar1 != 0)) {
    s_local._7_1_ = false;
  }
  else if (s->user == 0) {
    local_28 = 0;
    local_24 = 0;
    if ((a->imod & 2U) != 0) {
      if (a->A != 0) {
        local_24 = 0x100;
      }
      if (a->I != 0) {
        local_24 = local_24 | 0x80;
      }
      if (a->F != 0) {
        local_24 = local_24 | 0x40;
      }
      if ((a->imod & 1U) != 0) {
        local_28 = local_24;
      }
    }
    if (a->M != 0) {
      local_24 = local_24 | 0x1f;
      local_28 = a->mode | local_28;
    }
    if (local_24 != 0) {
      gen_set_psr_im(s,local_24,0,local_28);
    }
    s_local._7_1_ = true;
  }
  else {
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_CPS(DisasContext *s, arg_CPS *a)
{
    uint32_t mask, val;

    if (!ENABLE_ARCH_6 || arm_dc_feature(s, ARM_FEATURE_M)) {
        return false;
    }
    if (IS_USER(s)) {
        /* Implemented as NOP in user mode.  */
        return true;
    }
    /* TODO: There are quite a lot of UNPREDICTABLE argument combinations. */

    mask = val = 0;
    if (a->imod & 2) {
        if (a->A) {
            mask |= CPSR_A;
        }
        if (a->I) {
            mask |= CPSR_I;
        }
        if (a->F) {
            mask |= CPSR_F;
        }
        if (a->imod & 1) {
            val |= mask;
        }
    }
    if (a->M) {
        mask |= CPSR_M;
        val |= a->mode;
    }
    if (mask) {
        gen_set_psr_im(s, mask, 0, val);
    }
    return true;
}